

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O0

StringTree * __thiscall
kj::
strTree<char_const(&)[25],kj::CappedArray<char,17ul>&,char_const(&)[7],kj::StringTree,char_const(&)[4]>
          (StringTree *__return_storage_ptr__,kj *this,char (*params) [25],
          CappedArray<char,_17UL> *params_1,char (*params_2) [7],StringTree *params_3,
          char (*params_4) [4])

{
  char (*value) [25];
  CappedArray<char,_17UL> *value_00;
  char (*value_01) [7];
  StringTree *pSVar1;
  char (*value_02) [4];
  ArrayPtr<const_char> *in_stack_ffffffffffffff68;
  ArrayPtr<const_char> local_78;
  ArrayPtr<const_char> local_68;
  ArrayPtr<const_char> local_58;
  ArrayPtr<const_char> local_48;
  StringTree *local_38;
  char (*params_local_4) [4];
  StringTree *params_local_3;
  char (*params_local_2) [7];
  CappedArray<char,_17UL> *params_local_1;
  char (*params_local) [25];
  
  local_38 = params_3;
  params_local_4 = (char (*) [4])params_2;
  params_local_3 = (StringTree *)params_1;
  params_local_2 = (char (*) [7])params;
  params_local_1 = (CappedArray<char,_17UL> *)this;
  params_local = (char (*) [25])__return_storage_ptr__;
  value = ::const((char (*) [25])this);
  local_48 = _::toStringTreeOrCharSequence<char_const(&)[25]>(value);
  value_00 = fwd<kj::CappedArray<char,17ul>&>((CappedArray<char,_17UL> *)params_local_2);
  local_58 = _::toStringTreeOrCharSequence<kj::CappedArray<char,17ul>&>(value_00);
  value_01 = ::const((char (*) [7])params_local_3);
  local_68 = _::toStringTreeOrCharSequence<char_const(&)[7]>(value_01);
  pSVar1 = fwd<kj::StringTree>((NoInfer<kj::StringTree> *)params_local_4);
  pSVar1 = _::toStringTreeOrCharSequence(pSVar1);
  value_02 = ::const((char (*) [4])local_38);
  local_78 = _::toStringTreeOrCharSequence<char_const(&)[4]>(value_02);
  StringTree::
  concat<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,(StringTree *)&local_48,&local_58,&local_68,
             (ArrayPtr<const_char> *)pSVar1,(StringTree *)&local_78,in_stack_ffffffffffffff68);
  return __return_storage_ptr__;
}

Assistant:

StringTree strTree(Params&&... params) {
  return StringTree::concat(_::toStringTreeOrCharSequence(kj::fwd<Params>(params))...);
}